

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsslcontext_openssl.cpp
# Opt level: O2

void QSslContext::applyBackendConfig(QSslContext *sslContext)

{
  qsizetype qVar1;
  Data *pDVar2;
  bool bVar3;
  int iVar4;
  const_iterator cVar5;
  SSL_CONF_CTX *ptr;
  _Rb_tree_node_base *p_Var6;
  const_iterator cVar7;
  _Rb_tree_node_base *p_Var8;
  char16_t *pcVar9;
  _Base_ptr b;
  char *s;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_b8;
  QArrayDataPointer<char16_t> local_a0;
  QArrayDataPointer<char16_t> local_88;
  QMetaType local_70;
  QSharedPointer<ssl_conf_ctx_st> local_68;
  QArrayDataPointer<char16_t> local_58;
  QMap<QByteArray,_QVariant> local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  QSslConfiguration::backendConfiguration();
  if ((local_40.d.d.ptr ==
       (totally_ordered_wrapper<QMapData<std::map<QByteArray,_QVariant,_std::less<QByteArray>,_std::allocator<std::pair<const_QByteArray,_QVariant>_>_>_>_*>
        )0x0) || (*(long *)((long)local_40.d.d.ptr + 0x30) == 0)) goto LAB_00129dab;
  QByteArray::QByteArray((QByteArray *)&local_58,"Qt-OCSP-response",-1);
  cVar5 = QMap<QByteArray,_QVariant>::find(&local_40,(QByteArray *)&local_58);
  QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_58);
  cVar7._M_node = (_Base_ptr)((long)local_40.d.d.ptr + 0x10);
  if (local_40.d.d.ptr ==
      (totally_ordered_wrapper<QMapData<std::map<QByteArray,_QVariant,_std::less<QByteArray>,_std::allocator<std::pair<const_QByteArray,_QVariant>_>_>_>_*>
       )0x0) {
    cVar7._M_node = (_Base_ptr)0x0;
  }
  if (cVar5.i._M_node != (const_iterator)cVar7._M_node) {
    q_SSL_CTX_callback_ctrl(sslContext->ctx,0x3f,qt_OCSP_status_server_callback);
    if ((local_40.d.d.ptr !=
         (totally_ordered_wrapper<QMapData<std::map<QByteArray,_QVariant,_std::less<QByteArray>,_std::allocator<std::pair<const_QByteArray,_QVariant>_>_>_>_*>
          )0x0) && (*(long *)((long)local_40.d.d.ptr + 0x30) == 1)) goto LAB_00129dab;
  }
  local_68.value.ptr = (SSL_CONF_CTX *)0xaaaaaaaaaaaaaaaa;
  local_68.d = (Data *)0xaaaaaaaaaaaaaaaa;
  ptr = q_SSL_CONF_CTX_new();
  QSharedPointer<ssl_conf_ctx_st>::
  QSharedPointer<ssl_conf_ctx_st,_void_(*)(ssl_conf_ctx_st_*),_true>
            (&local_68,ptr,q_SSL_CONF_CTX_free);
  if (local_68.value.ptr == (SSL_CONF_CTX *)0x0) {
    QSslSocket::tr((QString *)&local_88,"SSL_CONF_CTX_new() failed",(char *)0x0,-1);
    msgErrorSettingBackendConfig((QString *)&local_58,(QString *)&local_88);
LAB_00129c3d:
    pDVar2 = (sslContext->errorStr).d.d;
    pcVar9 = (sslContext->errorStr).d.ptr;
    *(undefined4 *)&(sslContext->errorStr).d.d = local_58.d._0_4_;
    *(undefined4 *)((long)&(sslContext->errorStr).d.d + 4) = local_58.d._4_4_;
    *(undefined4 *)&(sslContext->errorStr).d.ptr = local_58.ptr._0_4_;
    *(undefined4 *)((long)&(sslContext->errorStr).d.ptr + 4) = local_58.ptr._4_4_;
    qVar1 = (sslContext->errorStr).d.size;
    (sslContext->errorStr).d.size = local_58.size;
    local_58.d = pDVar2;
    local_58.ptr = pcVar9;
    local_58.size = qVar1;
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_88);
    sslContext->errorCode = UnspecifiedError;
  }
  else {
    q_SSL_CONF_CTX_set_ssl_ctx(local_68.value.ptr,sslContext->ctx);
    q_SSL_CONF_CTX_set_flags(local_68.value.ptr,2);
    if (local_40.d.d.ptr ==
        (totally_ordered_wrapper<QMapData<std::map<QByteArray,_QVariant,_std::less<QByteArray>,_std::allocator<std::pair<const_QByteArray,_QVariant>_>_>_>_*>
         )0x0) {
      p_Var6 = (_Rb_tree_node_base *)0x0;
    }
    else {
      p_Var6 = *(_Rb_tree_node_base **)((long)local_40.d.d.ptr + 0x20);
    }
    while( true ) {
      p_Var8 = (_Rb_tree_node_base *)((long)local_40.d.d.ptr + 0x10);
      if (local_40.d.d.ptr ==
          (totally_ordered_wrapper<QMapData<std::map<QByteArray,_QVariant,_std::less<QByteArray>,_std::allocator<std::pair<const_QByteArray,_QVariant>_>_>_>_*>
           )0x0) {
        p_Var8 = (_Rb_tree_node_base *)0x0;
      }
      if (p_Var6 == p_Var8) break;
      p_Var8 = p_Var6 + 1;
      local_58.d = (Data *)0x138f05;
      bVar3 = operator==((QByteArray *)p_Var8,(char **)&local_58);
      if (!bVar3) {
        QMetaType::QMetaType(&local_70,0xc);
        bVar3 = QVariant::canConvert((QVariant *)&p_Var6[1]._M_right,local_70);
        if (!bVar3) {
          sslContext->errorCode = UnspecifiedError;
          QSslSocket::tr((QString *)&local_a0,"Expecting QByteArray for %1",(char *)0x0,-1);
          QString::arg<QByteArray,_true>
                    ((QString *)&local_88,(QString *)&local_a0,(QByteArray *)p_Var8,0,(QChar)0x20);
          msgErrorSettingBackendConfig((QString *)&local_58,(QString *)&local_88);
          pDVar2 = (sslContext->errorStr).d.d;
          pcVar9 = (sslContext->errorStr).d.ptr;
          (sslContext->errorStr).d.d = local_58.d;
          (sslContext->errorStr).d.ptr = local_58.ptr;
          qVar1 = (sslContext->errorStr).d.size;
          (sslContext->errorStr).d.size = local_58.size;
          local_58.d = pDVar2;
          local_58.ptr = pcVar9;
          local_58.size = qVar1;
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_88);
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_a0);
          goto LAB_00129da1;
        }
        QVariant::toByteArray();
        b = p_Var6[1]._M_parent;
        if (b == (_Base_ptr)0x0) {
          b = (_Base_ptr)&QByteArray::_empty;
        }
        pcVar9 = local_58.ptr;
        if (local_58.ptr == (char16_t *)0x0) {
          pcVar9 = (char16_t *)&QByteArray::_empty;
        }
        iVar4 = q_SSL_CONF_cmd(local_68.value.ptr,(char *)b,(char *)pcVar9);
        if (iVar4 != 2) {
          sslContext->errorCode = UnspecifiedError;
          if (iVar4 == 1) {
            s = "Wrong value for %1 (%2)";
          }
          else if (iVar4 == 0) {
            s = "An error occurred attempting to set %1 to %2";
          }
          else {
            s = "Unrecognized command %1 = %2";
          }
          QSslSocket::tr((QString *)&local_b8,s,(char *)0x0,-1);
          QString::arg<QByteArray_const&,QByteArray_const&>
                    ((type *)&local_a0,(QString *)&local_b8,(QByteArray *)p_Var8,
                     (QByteArray *)&local_58);
          msgErrorSettingBackendConfig((QString *)&local_88,(QString *)&local_a0);
          pDVar2 = (sslContext->errorStr).d.d;
          pcVar9 = (sslContext->errorStr).d.ptr;
          (sslContext->errorStr).d.d = local_88.d;
          (sslContext->errorStr).d.ptr = local_88.ptr;
          qVar1 = (sslContext->errorStr).d.size;
          (sslContext->errorStr).d.size = local_88.size;
          local_88.d = pDVar2;
          local_88.ptr = pcVar9;
          local_88.size = qVar1;
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_88);
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_a0);
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_b8);
          QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_58);
          goto LAB_00129da1;
        }
        QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_58);
      }
      p_Var6 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var6);
    }
    iVar4 = q_SSL_CONF_CTX_finish(local_68.value.ptr);
    if (iVar4 == 0) {
      QSslSocket::tr((QString *)&local_88,"SSL_CONF_finish() failed",(char *)0x0,-1);
      msgErrorSettingBackendConfig((QString *)&local_58,(QString *)&local_88);
      goto LAB_00129c3d;
    }
  }
LAB_00129da1:
  QSharedPointer<ssl_conf_ctx_st>::deref(local_68.d);
LAB_00129dab:
  QtPrivate::
  QExplicitlySharedDataPointerV2<QMapData<std::map<QByteArray,_QVariant,_std::less<QByteArray>,_std::allocator<std::pair<const_QByteArray,_QVariant>_>_>_>_>
  ::~QExplicitlySharedDataPointerV2(&local_40.d);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QSslContext::applyBackendConfig(QSslContext *sslContext)
{
    const QMap<QByteArray, QVariant> &conf = sslContext->sslConfiguration.backendConfiguration();
    if (conf.isEmpty())
        return;

#if QT_CONFIG(ocsp)
    auto ocspResponsePos = conf.find("Qt-OCSP-response");
    if (ocspResponsePos != conf.end()) {
        // This is our private, undocumented configuration option, existing only for
        // the purpose of testing OCSP status responses. We don't even check this
        // callback was set. If no - the test must fail.
        q_SSL_CTX_set_tlsext_status_cb(sslContext->ctx, QTlsPrivate::qt_OCSP_status_server_callback);
        if (conf.size() == 1)
            return;
    }
#endif // ocsp

    QSharedPointer<SSL_CONF_CTX> cctx(q_SSL_CONF_CTX_new(), &q_SSL_CONF_CTX_free);
    if (cctx) {
        q_SSL_CONF_CTX_set_ssl_ctx(cctx.data(), sslContext->ctx);
        q_SSL_CONF_CTX_set_flags(cctx.data(), SSL_CONF_FLAG_FILE);

        for (auto i = conf.constBegin(); i != conf.constEnd(); ++i) {
            if (i.key() == "Qt-OCSP-response") // This never goes to SSL_CONF_cmd().
                continue;

            if (!i.value().canConvert(QMetaType(QMetaType::QByteArray))) {
                sslContext->errorCode = QSslError::UnspecifiedError;
                sslContext->errorStr = msgErrorSettingBackendConfig(
                QSslSocket::tr("Expecting QByteArray for %1").arg(i.key()));
                return;
            }

            const QByteArray &value = i.value().toByteArray();
            const int result = q_SSL_CONF_cmd(cctx.data(), i.key().constData(), value.constData());
            if (result == 2)
                continue;

            sslContext->errorCode = QSslError::UnspecifiedError;
            switch (result) {
            case 0:
                sslContext->errorStr = msgErrorSettingBackendConfig(
                    QSslSocket::tr("An error occurred attempting to set %1 to %2")
                            .arg(i.key(), value));
                return;
            case 1:
                sslContext->errorStr = msgErrorSettingBackendConfig(
                    QSslSocket::tr("Wrong value for %1 (%2)").arg(i.key(), value));
                return;
            default:
                sslContext->errorStr = msgErrorSettingBackendConfig(
                    QSslSocket::tr("Unrecognized command %1 = %2").arg(i.key(), value));
                return;
            }
        }

        if (q_SSL_CONF_CTX_finish(cctx.data()) == 0) {
            sslContext->errorStr = msgErrorSettingBackendConfig(QSslSocket::tr("SSL_CONF_finish() failed"));
            sslContext->errorCode = QSslError::UnspecifiedError;
        }
    } else {
        sslContext->errorStr = msgErrorSettingBackendConfig(QSslSocket::tr("SSL_CONF_CTX_new() failed"));
        sslContext->errorCode = QSslError::UnspecifiedError;
    }
}